

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 556_reverseWordsInAString.cpp
# Opt level: O1

string * reverseWords(string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  pointer pcVar7;
  ulong uVar8;
  string *in_RDI;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  
  uVar11 = s->_M_string_length;
  uVar8 = 0;
  if (uVar11 != 0) {
    uVar6 = 0;
    do {
      pcVar3 = (s->_M_dataplus)._M_p;
      if (pcVar3[uVar6] == ' ') {
        lVar12 = (long)(int)uVar8;
        iVar5 = (int)uVar6;
        pcVar7 = pcVar3 + (long)iVar5 + -1;
        if (pcVar3 + lVar12 < pcVar7 && iVar5 != lVar12) {
          pcVar10 = pcVar3 + lVar12;
          do {
            pcVar9 = pcVar10 + 1;
            cVar2 = *pcVar10;
            *pcVar10 = *pcVar7;
            *pcVar7 = cVar2;
            pcVar7 = pcVar7 + -1;
            pcVar10 = pcVar9;
          } while (pcVar9 < pcVar7);
        }
        uVar8 = (ulong)(iVar5 + 1);
      }
      uVar6 = uVar6 + 1;
      uVar11 = s->_M_string_length;
    } while (uVar6 < uVar11);
    uVar8 = (ulong)(int)uVar8;
  }
  pcVar3 = (s->_M_dataplus)._M_p;
  pcVar7 = pcVar3 + (uVar11 - 1);
  if (pcVar3 + uVar8 < pcVar7 && uVar11 != uVar8) {
    pcVar10 = pcVar3 + uVar8;
    do {
      pcVar9 = pcVar10 + 1;
      cVar2 = *pcVar10;
      *pcVar10 = *pcVar7;
      *pcVar7 = cVar2;
      pcVar7 = pcVar7 + -1;
      pcVar10 = pcVar9;
    } while (pcVar9 < pcVar7);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar3 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&s->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar4;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar3;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

string reverseWords(string s) {
    int begin=0,end=-1;
    for (size_t i=0;i<s.size();i++)
    {
        if (s[i]==' ')
        {
            end = i;
            reverse(s.begin()+begin,s.begin()+end);
            begin = end+1;
        }
    }
    reverse(s.begin()+begin,s.end());
    return s;
}